

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

TestStatus *
vkt::pipeline::anon_unknown_0::testRasterSamplesConsistency
          (TestStatus *__return_storage_ptr__,Context *context,GeometryType geometryType)

{
  pointer *__first;
  bool bVar1;
  InstanceInterface *instanceInterface;
  VkPhysicalDevice physicalDevice;
  TextureLevel *this;
  ostream *poVar2;
  NotSupportedError *this_00;
  allocator<char> local_601;
  string local_600;
  undefined1 local_5da;
  allocator<char> local_5d9;
  string local_5d8;
  int local_5b4;
  string local_5b0;
  ostringstream local_590 [8];
  ostringstream message;
  ConstPixelBufferAccess local_418;
  deUint32 local_3ec;
  undefined1 local_3e8 [4];
  deUint32 uniqueColors;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  Vector<int,_2> local_3b8;
  undefined1 local_3b0 [8];
  MultisampleRenderer renderer;
  VkPipelineMultisampleStateCreateInfo multisampleStateParams;
  int samplesNdx;
  int renderCount;
  deUint32 prevUniqueColors;
  allocator<vkt::pipeline::Vertex4RGBA> local_b1;
  undefined1 local_b0 [8];
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  Vertex4RGBA vertexData [3];
  VkSampleCountFlagBits samples [7];
  GeometryType geometryType_local;
  Context *context_local;
  
  vertexData[2].color.m_data[2] = 1.4013e-45;
  vertexData[2].color.m_data[3] = 2.8026e-45;
  __first = &vertices.
             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)__first,-0.75,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(vertexData[0].position.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(vertexData[0].color.m_data + 2),0.75,0.125,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(vertexData[1].position.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(vertexData[1].color.m_data + 2),0.75,-0.125,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(vertexData[2].position.m_data + 2),1.0,0.0,0.0,1.0);
  std::allocator<vkt::pipeline::Vertex4RGBA>::allocator(&local_b1);
  std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
  vector<vkt::pipeline::Vertex4RGBA_const*,void>
            ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
             local_b0,(Vertex4RGBA *)__first,(Vertex4RGBA *)(vertexData[2].color.m_data + 2),
             &local_b1);
  std::allocator<vkt::pipeline::Vertex4RGBA>::~allocator(&local_b1);
  samplesNdx = 2;
  multisampleStateParams.alphaToOneEnable = 0;
  for (multisampleStateParams.alphaToCoverageEnable = 1;
      (int)multisampleStateParams.alphaToCoverageEnable < 7;
      multisampleStateParams.alphaToCoverageEnable =
           multisampleStateParams.alphaToCoverageEnable + 1) {
    instanceInterface = Context::getInstanceInterface(context);
    physicalDevice = Context::getPhysicalDevice(context);
    bVar1 = isSupportedSampleCount
                      (instanceInterface,physicalDevice,
                       samples[(long)(int)multisampleStateParams.alphaToCoverageEnable + -2]);
    if (bVar1) {
      renderer.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator.
      _0_4_ = 0x18;
      tcu::Vector<int,_2>::Vector(&local_3b8,0x20,0x20);
      getDefaultColorBlendAttachmentState();
      MultisampleRenderer::MultisampleRenderer
                ((MultisampleRenderer *)local_3b0,context,VK_FORMAT_R8G8B8A8_UNORM,&local_3b8,
                 VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,
                 (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
                 local_b0,(VkPipelineMultisampleStateCreateInfo *)
                          &renderer.m_fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.
                           deleter.m_allocator,
                 (VkPipelineColorBlendAttachmentState *)
                 &result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                  .m_data.field_0x8);
      MultisampleRenderer::render
                ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_3e8,
                 (MultisampleRenderer *)local_3b0);
      this = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
             operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                        local_3e8);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_418,this);
      local_3ec = getUniqueColorsCount(&local_418);
      multisampleStateParams.alphaToOneEnable = multisampleStateParams.alphaToOneEnable + 1;
      if (local_3ec < (uint)samplesNdx) {
        std::__cxx11::ostringstream::ostringstream(local_590);
        poVar2 = std::operator<<((ostream *)local_590,"More unique colors generated with ");
        poVar2 = (ostream *)
                 std::ostream::operator<<
                           (poVar2,samples[(long)(int)(multisampleStateParams.alphaToCoverageEnable
                                                      - 1) + -2]);
        poVar2 = std::operator<<(poVar2," than with ");
        std::ostream::operator<<
                  (poVar2,samples[(long)(int)multisampleStateParams.alphaToCoverageEnable + -2]);
        std::__cxx11::ostringstream::str();
        tcu::TestStatus::fail(__return_storage_ptr__,&local_5b0);
        std::__cxx11::string::~string((string *)&local_5b0);
        local_5b4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_590);
      }
      else {
        local_5b4 = 0;
        samplesNdx = local_3ec;
      }
      de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
                ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_3e8);
      MultisampleRenderer::~MultisampleRenderer((MultisampleRenderer *)local_3b0);
      if (local_5b4 != 0) goto LAB_0091e0cc;
    }
  }
  if (multisampleStateParams.alphaToOneEnable == 0) {
    local_5da = 1;
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5d8,"Multisampling is unsupported",&local_5d9);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_5d8);
    local_5da = 0;
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_600,"Number of unique colors increases as the sample count increases",
             &local_601);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_600);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  local_5b4 = 1;
LAB_0091e0cc:
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::~vector
            ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
             local_b0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testRasterSamplesConsistency (Context& context, GeometryType geometryType)
{
	// Use triangle only.
	DE_UNREF(geometryType);

	const VkSampleCountFlagBits samples[] =
	{
		VK_SAMPLE_COUNT_1_BIT,
		VK_SAMPLE_COUNT_2_BIT,
		VK_SAMPLE_COUNT_4_BIT,
		VK_SAMPLE_COUNT_8_BIT,
		VK_SAMPLE_COUNT_16_BIT,
		VK_SAMPLE_COUNT_32_BIT,
		VK_SAMPLE_COUNT_64_BIT
	};

	const Vertex4RGBA vertexData[3] =
	{
		{
			tcu::Vec4(-0.75f, 0.0f, 0.0f, 1.0f),
			tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
		},
		{
			tcu::Vec4(0.75f, 0.125f, 0.0f, 1.0f),
			tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
		},
		{
			tcu::Vec4(0.75f, -0.125f, 0.0f, 1.0f),
			tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
		}
	};

	const std::vector<Vertex4RGBA>	vertices			(vertexData, vertexData + 3);
	deUint32						prevUniqueColors	= 2;
	int								renderCount			= 0;

	// Do not render with 1 sample (start with samplesNdx = 1).
	for (int samplesNdx = 1; samplesNdx < DE_LENGTH_OF_ARRAY(samples); samplesNdx++)
	{
		if (!isSupportedSampleCount(context.getInstanceInterface(), context.getPhysicalDevice(), samples[samplesNdx]))
			continue;

		const VkPipelineMultisampleStateCreateInfo multisampleStateParams =
		{
			VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// VkStructureType							sType;
			DE_NULL,													// const void*								pNext;
			0u,															// VkPipelineMultisampleStateCreateFlags	flags;
			samples[samplesNdx],										// VkSampleCountFlagBits					rasterizationSamples;
			false,														// VkBool32									sampleShadingEnable;
			0.0f,														// float									minSampleShading;
			DE_NULL,													// const VkSampleMask*						pSampleMask;
			false,														// VkBool32									alphaToCoverageEnable;
			false														// VkBool32									alphaToOneEnable;
		};

		MultisampleRenderer				renderer		(context, VK_FORMAT_R8G8B8A8_UNORM, tcu::IVec2(32, 32), VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, vertices, multisampleStateParams, getDefaultColorBlendAttachmentState());
		de::MovePtr<tcu::TextureLevel>	result			= renderer.render();
		const deUint32					uniqueColors	= getUniqueColorsCount(result->getAccess());

		renderCount++;

		if (prevUniqueColors > uniqueColors)
		{
			std::ostringstream message;

			message << "More unique colors generated with " << samples[samplesNdx - 1] << " than with " << samples[samplesNdx];
			return tcu::TestStatus::fail(message.str());
		}

		prevUniqueColors = uniqueColors;
	}

	if (renderCount == 0)
		throw tcu::NotSupportedError("Multisampling is unsupported");

	return tcu::TestStatus::pass("Number of unique colors increases as the sample count increases");
}